

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYs<unsigned_long_long> *getter2,TransformerLinLog *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  GetterXsYs<unsigned_long_long> *pGVar7;
  TransformerLinLog *pTVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  long lVar14;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar13 = iVar5;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  lVar14 = (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride;
  uVar1 = *(unsigned_long_long *)((long)getter1->Xs + lVar14);
  uVar2 = *(unsigned_long_long *)((long)getter1->Ys + lVar14);
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar6 = pIVar12->CurrentPlot;
  dVar3 = pIVar6->YAxis[iVar5].Range.Min;
  IVar4 = pIVar12->PixelRange[iVar5].Min;
  IVar9.y = (float)(pIVar12->My[iVar5] *
                    (((double)(float)(dVar11 / pIVar12->LogDenY[iVar5]) *
                      (pIVar6->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) + (double)IVar4.y);
  IVar9.x = (float)(pIVar12->Mx *
                    ((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                    (pIVar6->XAxis).Range.Min) + (double)IVar4.x);
  this->P11 = IVar9;
  pIVar12 = GImPlot;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  lVar14 = (long)((pGVar7->Offset % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar7->Xs + lVar14);
  uVar2 = *(unsigned_long_long *)((long)pGVar7->Ys + lVar14);
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar6 = pIVar12->CurrentPlot;
  dVar3 = pIVar6->YAxis[iVar5].Range.Min;
  IVar4 = pIVar12->PixelRange[iVar5].Min;
  IVar10.y = (float)(pIVar12->My[iVar5] *
                     (((double)(float)(dVar11 / pIVar12->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) + (double)IVar4.y)
  ;
  IVar10.x = (float)(pIVar12->Mx *
                     ((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                     (pIVar6->XAxis).Range.Min) + (double)IVar4.x);
  this->P12 = IVar10;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }